

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,Tag *tag)

{
  Tag *pTVar1;
  long in_FS_OFFSET;
  quint32 value;
  ulong local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  value = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&value);
  local_28 = (ulong)CONCAT14(value != 0,value);
  if (value == 0) {
    QDataStream::setStatus((Status)stream);
  }
  else {
    pTVar1 = std::_Optional_base_impl<QFont::Tag,_std::_Optional_base<QFont::Tag,_true,_true>_>::
             _M_get((_Optional_base_impl<QFont::Tag,_std::_Optional_base<QFont::Tag,_true,_true>_> *
                    )&local_28);
    tag->m_value = pTVar1->m_value;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QFont::Tag &tag)
{
    quint32 value;
    stream >> value;
    if (const auto maybeTag = QFont::Tag::fromValue(value))
        tag = *maybeTag;
    else
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}